

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirentryinfo_p.h
# Opt level: O2

bool __thiscall QDirEntryInfo::isReadable(QDirEntryInfo *this)

{
  bool bVar1;
  QFileInfo *this_00;
  QFileSystemMetaData *pQVar2;
  
  if ((this->fileInfoOpt).super__Optional_base<QFileInfo,_false,_false>._M_payload.
      super__Optional_payload<QFileInfo,_true,_false,_false>.super__Optional_payload_base<QFileInfo>
      ._M_engaged == true) {
    this_00 = std::_Optional_base_impl<QFileInfo,_std::_Optional_base<QFileInfo,_false,_false>_>::
              _M_get((_Optional_base_impl<QFileInfo,_std::_Optional_base<QFileInfo,_false,_false>_>
                      *)&this->fileInfoOpt);
    bVar1 = QFileInfo::isReadable(this_00);
    return bVar1;
  }
  pQVar2 = ensureFilled(this,(MetaDataFlags)0x400);
  return (bool)((*(byte *)((long)&(pQVar2->entryFlags).
                                  super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 1) & 4)
               >> 2);
}

Assistant:

bool isReadable() {
        if (fileInfoOpt)
            return fileInfoOpt->isReadable();

        return ensureFilled(QFileSystemMetaData::UserReadPermission).isReadable();
    }